

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP5Writer::Init(BP5Writer *this)

{
  int iVar1;
  
  (this->m_BP5Serializer).m_Engine = &this->super_Engine;
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  (this->super_BP5Engine).m_RankMPI = iVar1;
  InitParameters(this);
  InitAggregator(this);
  InitTransports(this);
  InitBPBuffer(this);
  return;
}

Assistant:

void BP5Writer::Init()
{
    m_BP5Serializer.m_Engine = this;
    m_RankMPI = m_Comm.Rank();
    InitParameters();
    InitAggregator();
    InitTransports();
    InitBPBuffer();
}